

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O2

Polynom<Rational> __thiscall
Polynom<Rational>::operator*(Polynom<Rational> *this,Polynom<Rational> *a)

{
  int iVar1;
  uint uVar2;
  long in_RDX;
  Rational *extraout_RDX;
  int iVar3;
  uint uVar4;
  Polynom<Rational> PVar5;
  Rational local_70;
  
  Polynom(this,((a->m).N + *(int *)(in_RDX + 4)) - 1);
  iVar1 = 0;
  for (uVar2 = 0; uVar2 < (a->m).N; uVar2 = uVar2 + 1) {
    iVar3 = -1;
    for (uVar4 = 0; uVar4 < *(uint *)(in_RDX + 4); uVar4 = uVar4 + 1) {
      ::operator*(&local_70,(a->m).arr + ((a->m).N + ~uVar2),
                  (Rational *)
                  ((ulong)(*(uint *)(in_RDX + 4) + iVar3) * 0x40 + *(long *)(in_RDX + 8)));
      Rational::operator+=((this->m).arr + (iVar1 + iVar3 + (this->m).N),&local_70);
      Rational::~Rational(&local_70);
      iVar3 = iVar3 + -1;
    }
    iVar1 = iVar1 + -1;
  }
  strip(this);
  PVar5.m.arr = extraout_RDX;
  PVar5.m._0_8_ = this;
  return (Polynom<Rational>)PVar5.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::operator*(const Polynom &a) const
{
    Polynom temp(m.width() + a.m.width() - 1);
    for(unsigned i = 0; i < m.width(); ++i)
    {
        for(unsigned j = 0; j < a.m.width(); ++j)
        {
            temp.m[0][temp.m.width() - 1 - i - j] += m[0][m.width() - 1 - i] * a.m[0][a.m.width() - 1 - j];
        }
    }
    temp.strip();
    return temp;
}